

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
CP::priority_queue<int,_std::less<int>_>::at_level
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          priority_queue<int,_std::less<int>_> *this,size_t k)

{
  iterator __position;
  ostream *poVar1;
  ulong uVar2;
  size_t sVar3;
  int *__args;
  size_t i;
  ulong uVar4;
  long lVar5;
  size_type __n;
  ulong uVar6;
  pointer local_40;
  pointer local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (size_type)(1 << ((byte)k & 0x1f));
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  if (k == 0) {
    uVar4 = 0;
  }
  else {
    sVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (long)(1 << ((byte)sVar3 & 0x1f));
      sVar3 = sVar3 + 1;
    } while (k != sVar3);
  }
  uVar6 = __n + uVar4;
  uVar2 = this->mSize;
  if (uVar6 <= this->mSize) {
    uVar2 = uVar6;
  }
  if (uVar4 < uVar2) {
    lVar5 = uVar4 * 8;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      __args = (int *)((long)this->mData + lVar5);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar4 = uVar4 + 1;
      uVar2 = this->mSize;
      if (uVar6 <= this->mSize) {
        uVar2 = uVar6;
      }
      lVar5 = lVar5 + 4;
    } while (uVar4 < uVar2);
  }
  local_40 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if ((long)local_38 - (long)local_40 != 0) {
    uVar4 = (long)local_38 - (long)local_40 >> 2;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              (&local_38,&local_40,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              ();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> CP::priority_queue<T,Comp>::at_level(size_t k) const {
    std::vector<T> r;
    r.reserve(1 << k);
    size_t ind = 0;
    for (size_t i = 0; i < k; ++i) {
        ind += 1 << i;
    }
    for (size_t i = ind; i < std::min(ind + (1 << k), mSize); ++i) {
        std::cout << i << std::endl;
        r.emplace_back(mData[ind+i]);
    }
    std::sort(r.rbegin(), r.rend(), mLess);
    return r;
}